

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  bitset_container_t *c;
  _Bool _Var1;
  uint i;
  int iVar2;
  array_container_t *src;
  run_container_t *c_00;
  ushort hb;
  uint16_t lb_start;
  uint8_t typecode;
  uint uVar3;
  uint64_t uVar4;
  uint8_t local_55;
  uint local_54;
  bitset_container_t *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (range_start < range_end) {
    uVar4 = 0x100000000;
    if (range_end < 0x100000000) {
      uVar4 = range_end;
    }
    hb = (ushort)(range_start >> 0x10);
    local_40 = uVar4 - 1;
    local_54 = (uint)(local_40 >> 0x10) & 0xffff;
    lb_start = (uint16_t)range_start;
    if ((uint16_t)(local_40 >> 0x10) == hb) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,(uint16_t)local_40);
      return;
    }
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,0xffff);
      hb = hb + 1;
    }
    local_38 = local_40 & 0xffff;
    local_44 = local_54 - (local_38 != 0xffff) & 0xffff;
    for (uVar3 = (uint)hb; uVar3 <= local_44; uVar3 = uVar3 + 1) {
      i = ra_get_index(&x1->high_low_container,(uint16_t)uVar3);
      if ((int)i < 0) {
        c_00 = run_container_create_range(0,0x10000);
        ra_insert_new_key_value_at(&x1->high_low_container,~i,(uint16_t)uVar3,c_00,'\x03');
      }
      else {
        local_55 = (x1->high_low_container).typecodes[i & 0xffff];
        src = (array_container_t *)
              get_writable_copy_if_shared((x1->high_low_container).containers[i & 0xffff],&local_55)
        ;
        local_50 = (bitset_container_t *)0x0;
        if (local_55 == '\x03') {
          iVar2 = run_container_negation_inplace((run_container_t *)src,&local_50);
          typecode = (uint8_t)iVar2;
        }
        else if (local_55 == '\x02') {
          local_50 = bitset_container_create();
          array_container_negation(src,local_50);
          array_container_free(src);
          typecode = '\x01';
        }
        else {
          _Var1 = bitset_container_negation_inplace((bitset_container_t *)src,&local_50);
          typecode = '\x02' - _Var1;
        }
        c = local_50;
        iVar2 = container_get_cardinality(local_50,typecode);
        if (iVar2 == 0) {
          container_free(c,typecode);
          ra_remove_at_index(&x1->high_low_container,i);
        }
        else {
          (x1->high_low_container).containers[i] = c;
          (x1->high_low_container).typecodes[i] = typecode;
        }
      }
    }
    if ((int)local_38 != 0xffff) {
      inplace_flip_container(&x1->high_low_container,(uint16_t)local_54,0,(uint16_t)local_40);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}